

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.hpp
# Opt level: O0

void __thiscall myvk::Buffer::UpdateData<unsigned_int>(Buffer *this,uint *data,uint32_t byte_offset)

{
  Buffer *in_RSI;
  Buffer *in_RDI;
  uint *in_stack_ffffffffffffffc0;
  uint *in_stack_ffffffffffffffc8;
  uint *__last;
  uint *in_stack_ffffffffffffffd0;
  
  if (in_RDI->m_mapped_ptr == (void *)0x0) {
    __last = (uint *)((long)&(in_RSI->super_BufferBase).super_DeviceObjectBase.super_Base._vptr_Base
                     + 4);
    Map(in_RSI);
    std::copy<unsigned_int_const*,unsigned_int*>(in_stack_ffffffffffffffd0,__last,(uint *)in_RSI);
    Unmap(in_RSI);
  }
  else {
    GetMappedData(in_RDI);
    std::copy<unsigned_int_const*,unsigned_int*>
              ((uint *)in_RSI,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

inline void UpdateData(const T &data, uint32_t byte_offset = 0) const {
		if (m_mapped_ptr) {
			std::copy(&data, &data + 1, (T *)((uint8_t *)GetMappedData() + byte_offset));
		} else {
			std::copy(&data, &data + 1, (T *)((uint8_t *)Map() + byte_offset));
			Unmap();
		}
	}